

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O3

void av1_estimate_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int best_early_term,uint ref_cost_intra
               ,int reuse_prediction,buf_2d *orig_dst,PRED_BUFFER *tmp_buffers,
               PRED_BUFFER **this_mode_pred,RD_STATS *best_rdc,BEST_PICKMODE *best_pickmode,
               PICK_MODE_CONTEXT *ctx,uint *best_sad_norm)

{
  MACROBLOCKD *xd;
  uint64_t uVar1;
  uint64_t uVar2;
  byte tx_size;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  PREDICTION_MODE mode;
  BLOCK_SIZE BVar6;
  byte bVar7;
  ushort uVar8;
  ushort uVar9;
  aom_tune_content aVar10;
  uint uVar11;
  int iVar12;
  SOURCE_SAD SVar13;
  MB_MODE_INFO *pMVar14;
  PRED_BUFFER *pPVar15;
  SequenceHeader *pSVar16;
  byte bVar17;
  bool bVar18;
  undefined4 uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  undefined7 in_register_00000011;
  int *piVar25;
  long lVar26;
  uint8_t *puVar27;
  int iVar28;
  byte bVar29;
  ushort uVar30;
  uint uVar31;
  ushort uVar32;
  uint8_t *puVar33;
  BLOCK_SIZE BVar34;
  ulong uVar35;
  uint8_t *local_110;
  uint8_t *local_108;
  RD_STATS local_e8;
  long local_c0;
  long local_b8;
  AV1_COMP *local_b0;
  MACROBLOCK *local_a8;
  PREDICTION_MODE local_a0;
  int local_9c;
  RD_STATS *local_98;
  uint local_90;
  undefined2 local_8c;
  ulong local_88;
  ulong local_80;
  int (*local_78) [7];
  uint8_t *local_70;
  uint8_t *local_68;
  int (*local_60) [169];
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar35 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  pMVar14 = *(x->e_mbd).mi;
  uVar8 = *(ushort *)&pMVar14->field_0xa7;
  aVar10 = (cpi->oxcf).tune_cfg.content;
  iVar20 = av1_get_intra_cost_penalty
                     ((cpi->common).quant_params.base_qindex,(cpi->common).quant_params.y_dc_delta_q
                      ,((cpi->common).seq_params)->bit_depth);
  iVar21 = (cpi->sf).rt_sf.check_intra_pred_nonrd;
  if ((((0 < (cpi->svc).spatial_layer_id) && (best_pickmode->best_ref_frame != '\x04')) &&
      (lVar22 = (long)(cpi->svc).temporal_layer_id, 0 < lVar22)) &&
     ((cpi->svc).layer_context[lVar22].is_key_frame == 0)) {
    iVar21 = 0;
  }
  if (cpi->ppi->use_svc == 0) {
    uVar24 = 0x32;
    uVar30 = 0x20;
    if (((cpi->sf).rt_sf.use_nonrd_altref_frame == 0) &&
       (0 < (cpi->sf).rt_sf.nonrd_prune_ref_frame_search)) goto LAB_00221b03;
  }
  else {
LAB_00221b03:
    uVar24 = 0x96;
    uVar30 = 0;
  }
  lVar22 = (long)((ulong)(iVar20 + ref_cost_intra) * (long)x->rdmult + 0x100) >> 9;
  uVar11 = x->source_variance;
  BVar34 = (BLOCK_SIZE)uVar35;
  if (uVar24 <= uVar11) {
    bVar17 = 1;
    if ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0) {
      bVar18 = false;
    }
    else {
      bVar18 = false;
      if ((x->content_state_sb).source_sad_nonrd < kMedSad) {
        iVar21 = 0;
      }
    }
    goto LAB_00221cb1;
  }
  bVar17 = 1;
  if (best_rdc->rdcost != 0x7fffffffffffffff) {
    if (best_pickmode->best_ref_frame == '\x01') {
      uVar9 = pMVar14->mv[0].as_mv.row;
      uVar32 = -uVar9;
      if (0 < (short)uVar9) {
        uVar32 = uVar9;
      }
      if (uVar32 < uVar30) {
        uVar9 = pMVar14->mv[0].as_mv.col;
        uVar32 = -uVar9;
        if (0 < (short)uVar9) {
          uVar32 = uVar9;
        }
        if (uVar32 < uVar30) goto LAB_00221bd9;
      }
    }
    iVar20 = iVar20 >> 2;
    lVar22 = (long)((ulong)(iVar20 + ref_cost_intra) * (long)x->rdmult + 0x100) >> 9;
    bVar17 = 0;
  }
LAB_00221bd9:
  uVar31 = 0x32;
  if (0x32 < uVar24 >> 1) {
    uVar31 = uVar24 >> 1;
  }
  bVar18 = false;
  if ((uVar11 < uVar31) &&
     ((kMedSad < (x->content_state_sb).source_sad_nonrd ||
      ((bVar18 = false, uVar11 < 0x32 && aVar10 == AOM_CONTENT_SCREEN &&
       (((BLOCK_32X16 < BVar34 && ((x->content_state_sb).source_sad_nonrd != kZeroSad)) ||
        ((x->color_sensitivity[0] == '\x01' || (x->color_sensitivity[1] == '\x01')))))))))) {
    bVar18 = true;
  }
  if (BLOCK_32X16 < BVar34) {
    best_early_term = 0;
  }
LAB_00221cb1:
  iVar28 = iVar21;
  if (((best_rdc->skip_txfm != '\0') && (best_pickmode->best_mode_initial_skip_flag != '\0')) &&
     (((iVar12 = (cpi->sf).rt_sf.skip_intra_pred, iVar12 != 1 ||
       (iVar28 = 0, best_pickmode->best_mode == '\x10')) && (iVar28 = iVar21, iVar12 == 2)))) {
    iVar28 = 0;
  }
  if ((best_rdc->rdcost == 0x7fffffffffffffff || bVar18) ||
     (((best_early_term == 0 && (iVar28 != 0)) && (BVar34 <= (cpi->sf).part_sf.max_intra_bsize)))) {
    lVar23 = lVar22 * 7 >> 3;
    if (aVar10 != AOM_CONTENT_SCREEN) {
      lVar23 = lVar22;
    }
    if (lVar23 <= best_rdc->rdcost) {
      local_90 = 0xffffffff;
      local_8c = 0;
      if (((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) && (10 < (cpi->oxcf).speed)) &&
          ((cpi->rc).high_source_sad != 0)) &&
         ((2 < (cpi->sf).rt_sf.prune_palette_search_nonrd ||
          ((((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0 &&
            ((cpi->rc).frame_spatial_variance < 0x4b0)) &&
           (((cpi->rc).perc_spatial_flat_blocks < 5 &&
            ((uVar11 < 4000 && (0x62 < (cpi->rc).percent_blocks_with_motion)))))))))) {
        local_8c = 0x100;
      }
      tx_size = ""[uVar35];
      bVar3 = ""[(x->txfm_search_params).tx_mode_search_type];
      if (tx_size < ""[(x->txfm_search_params).tx_mode_search_type]) {
        bVar3 = tx_size;
      }
      bVar29 = 2;
      if (bVar3 < 2) {
        bVar29 = bVar3;
      }
      bVar3 = bVar29;
      if ((aVar10 == AOM_CONTENT_SCREEN) && ((cpi->rc).high_source_sad != 0)) {
        bVar3 = 0;
        if (uVar11 <= uVar24) {
          bVar3 = bVar29;
        }
        if (BLOCK_16X16 < bsize) {
          bVar3 = bVar29;
        }
      }
      pPVar15 = best_pickmode->best_pred;
      local_b0 = cpi;
      local_a8 = x;
      if ((pPVar15 != (PRED_BUFFER *)0x0 && reuse_prediction != 0) &&
         (pPVar15->data == orig_dst->buf)) {
        uVar4 = block_size_wide[uVar35];
        uVar5 = block_size_high[uVar35];
        piVar25 = &tmp_buffers->in_use;
        lVar22 = 0;
        do {
          if (*piVar25 == 0) {
            *piVar25 = 1;
            goto LAB_00221eff;
          }
          lVar22 = lVar22 + 1;
          piVar25 = piVar25 + 4;
        } while (lVar22 != 3);
        lVar22 = -1;
LAB_00221eff:
        *this_mode_pred = tmp_buffers + lVar22;
        (*aom_convolve_copy)
                  (pPVar15->data,(long)pPVar15->stride,tmp_buffers[lVar22].data,
                   (long)tmp_buffers[lVar22].stride,(int)uVar4,(int)uVar5);
        best_pickmode->best_pred = *this_mode_pred;
      }
      xd = &x->e_mbd;
      local_60 = x->thresh_freq_fact + uVar35;
      puVar27 = orig_dst->buf;
      puVar33 = orig_dst->buf0;
      iVar21 = orig_dst->height;
      iVar28 = orig_dst->stride;
      uVar19 = *(undefined4 *)&orig_dst->field_0x1c;
      (x->e_mbd).plane[0].dst.width = orig_dst->width;
      (x->e_mbd).plane[0].dst.height = iVar21;
      (x->e_mbd).plane[0].dst.stride = iVar28;
      *(undefined4 *)&(x->e_mbd).plane[0].dst.field_0x1c = uVar19;
      (x->e_mbd).plane[0].dst.buf = puVar27;
      (x->e_mbd).plane[0].dst.buf0 = puVar33;
      local_b8 = (long)(1 << (tx_size & 0x1f));
      local_78 = (x->mode_costs).angle_delta_cost;
      local_c0 = local_b8 * 4;
      local_88 = (ulong)((uint)(0x2f0bffL >> (BVar34 & 0x3f)) & 1);
      local_80 = (ulong)((uint)(0x1f07ffL >> (BVar34 & 0x3f)) & 1);
      lVar22 = 0;
      do {
        mode = ""[lVar22];
        iVar21 = (cpi->rd).threshes[uVar8 & 7][uVar35]
                 [mode_idx[0][*(long *)(&DAT_00501650 + (long)(char)mode * 8)]];
        SVar13 = (x->content_state_sb).source_sad_nonrd;
        if ((((bool)(bVar18 & lVar22 != 3)) ||
            ((((uint)(cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar35] >>
               ((int)(char)mode & 0x1fU) & 1) != 0 &&
             (((lVar22 == 0 || ((cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad != true)) ||
              (((x->color_sensitivity[0] != '\0' && (x->color_sensitivity[1] != '\0')) &&
               (((uVar1 = (cpi->rc).frame_source_sad, uVar2 = (cpi->rc).avg_source_sad,
                 (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.1 <
                 ((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) ||
                 (((byte)uVar8 & 7) - 1 < 2)) || (kMedSad < SVar13)))))))))) &&
           (((aVar10 != AOM_CONTENT_SCREEN || ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0)) ||
            (((SVar13 != kZeroSad || ((lVar22 == 0 || (x->source_variance != 0)))) &&
             ((bsize < BLOCK_32X64 || (x->source_variance < 0x33)))))))) {
          if (((bool)(~bVar17 & lVar22 != 3)) ||
             (iVar21 != 0x7fffffff &&
              (long)(*local_60)[mode_idx[0][*(long *)(&DAT_00501650 + (long)(char)mode * 8)]] *
              (long)iVar21 >> 5 <= best_rdc->rdcost)) {
            BVar34 = av1_ss_size_lookup[uVar35][(x->e_mbd).plane[1].subsampling_x]
                     [(x->e_mbd).plane[1].subsampling_y];
            pMVar14->mode = mode;
            pMVar14->ref_frame[0] = '\0';
            pMVar14->ref_frame[1] = -1;
            local_e8.rate = 0x7fffffff;
            local_e8.zero_rate = 0;
            local_e8.dist = 0x7fffffffffffffff;
            local_e8.rdcost = 0x7fffffffffffffff;
            local_e8.sse = 0x7fffffffffffffff;
            local_e8.skip_txfm = '\0';
            local_9c = 1;
            local_98 = &local_e8;
            pMVar14->tx_size = bVar3;
            local_108 = x->plane[0].src.buf;
            iVar21 = (x->e_mbd).plane[0].subsampling_x;
            iVar28 = (x->e_mbd).plane[0].subsampling_y;
            BVar6 = av1_ss_size_lookup[uVar35][iVar21][iVar28];
            iVar12 = (x->e_mbd).mb_to_bottom_edge;
            local_110 = (x->e_mbd).plane[0].dst.buf;
            uVar24 = (int)((iVar12 >> 0x1f & iVar12 >> ((char)iVar28 + 3U & 0x1f)) +
                          (uint)block_size_high[BVar6]) >> 2;
            bVar29 = bVar3;
            local_a0 = mode;
            if (0 < (int)uVar24) {
              iVar28 = (x->e_mbd).mb_to_right_edge;
              iVar12 = (x->e_mbd).plane[0].dst.stride;
              pSVar16 = (cpi->common).seq_params;
              iVar21 = (int)((uint)block_size_wide[BVar6] +
                            (iVar28 >> 0x1f & iVar28 >> ((char)iVar21 + 3U & 0x1f))) >> 2;
              local_38 = (long)iVar21;
              local_50 = (ulong)uVar24;
              local_58 = local_c0 * iVar12;
              local_48 = x->plane[0].src.stride * local_c0;
              lVar26 = 0;
              lVar23 = local_b8;
              local_70 = local_110;
              local_68 = local_108;
              do {
                local_40 = lVar26;
                if (0 < iVar21) {
                  bVar29 = block_size_wide[uVar35];
                  bVar7 = block_size_high[uVar35];
                  lVar26 = 0;
                  puVar27 = local_110;
                  puVar33 = local_108;
                  do {
                    x->plane[0].src.buf = puVar33;
                    (x->e_mbd).plane[0].dst.buf = puVar27;
                    av1_predict_intra_block
                              (xd,pSVar16->sb_size,(uint)pSVar16->enable_intra_edge_filter,
                               (uint)bVar29,(uint)bVar7,tx_size,mode,0,0,'\x05',puVar27,iVar12,
                               puVar27,iVar12,0,0,0);
                    lVar26 = lVar26 + local_b8;
                    puVar27 = puVar27 + local_c0;
                    puVar33 = puVar33 + local_c0;
                    lVar23 = local_b8;
                  } while (lVar26 < local_38);
                }
                lVar26 = local_40 + lVar23;
                local_110 = local_110 + local_58;
                local_108 = local_108 + local_48;
              } while (lVar26 < (long)local_50);
              bVar29 = pMVar14->tx_size;
              local_108 = local_68;
              local_110 = local_70;
            }
            x->plane[0].src.buf = local_108;
            (x->e_mbd).plane[0].dst.buf = local_110;
            av1_block_yrd(x,&local_e8,&local_9c,bsize,bVar29);
            if (x->color_sensitivity[0] != '\0') {
              av1_foreach_transformed_block_in_plane(xd,BVar34,1,av1_estimate_block_intra,&local_b0)
              ;
            }
            if (x->color_sensitivity[1] != '\0') {
              av1_foreach_transformed_block_in_plane(xd,BVar34,2,av1_estimate_block_intra,&local_b0)
              ;
            }
            iVar21 = 0;
            if ((BLOCK_8X4 < bsize) && (iVar21 = 0, 0xf7 < (byte)(mode - 9))) {
              iVar21 = local_78[(long)(char)mode + -1][(long)pMVar14->angle_delta[0] + 3];
            }
            if ((((lVar22 == 0) && (bsize != BLOCK_INVALID)) &&
                (((cpi->common).seq_params)->enable_filter_intra != '\0')) &&
               ((local_80 != 0 && (local_88 != 0)))) {
              iVar21 = iVar21 + (x->mode_costs).filter_intra_cost[uVar35][0];
            }
            iVar21 = iVar21 + iVar20 + ref_cost_intra + local_e8.rate;
            local_e8.rate = iVar21;
            local_e8.rdcost = local_e8.dist * 0x80 + ((long)x->rdmult * (long)iVar21 + 0x100 >> 9);
            if ((aVar10 == AOM_CONTENT_SCREEN) && ((cpi->sf).rt_sf.source_metrics_sb_nonrd != 0)) {
              if ((cpi->rc).high_source_sad == 0) {
                if ((((x->source_variance != 0) &&
                     ((x->content_state_sb).source_sad_nonrd == kZeroSad)) &&
                    (x->color_sensitivity[0] == '\0')) && (x->color_sensitivity[1] == '\0')) {
                  local_e8.rdcost = (local_e8.rdcost >> 1) + local_e8.rdcost;
                }
              }
              else if ((x->source_variance < 800) &&
                      ((x->color_sensitivity[0] != '\0' || (x->color_sensitivity[1] != '\0')))) {
                local_e8.rdcost = local_e8.rdcost * 7 >> 3;
              }
            }
            if (local_e8.rdcost < best_rdc->rdcost) {
              *(ulong *)&best_rdc->skip_txfm = CONCAT71(local_e8._33_7_,local_e8.skip_txfm);
              best_rdc->rdcost = local_e8.rdcost;
              best_rdc->sse = local_e8.sse;
              best_rdc->rate = iVar21;
              best_rdc->zero_rate = local_e8.zero_rate;
              best_rdc->dist = local_e8.dist;
              best_pickmode->best_mode = mode;
              best_pickmode->best_tx_size = pMVar14->tx_size;
              best_pickmode->best_ref_frame = '\0';
              best_pickmode->best_second_ref_frame = '\0';
              best_pickmode->best_mode_skip_txfm = local_e8.skip_txfm;
              pMVar14->uv_mode = mode;
              pMVar14->mv[0] = (int_mv)0x80008000;
              pMVar14->mv[1] = (int_mv)0x80008000;
              if (local_e8.skip_txfm == '\0') {
                memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
              }
            }
          }
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 4);
      if (best_pickmode->best_ref_frame == '\0') {
        memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
      }
      pMVar14->tx_size = best_pickmode->best_tx_size;
      *best_sad_norm = local_90 >> (""[uVar35] + ""[uVar35] & 0x1f);
    }
  }
  return;
}

Assistant:

void av1_estimate_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                             int best_early_term, unsigned int ref_cost_intra,
                             int reuse_prediction, struct buf_2d *orig_dst,
                             PRED_BUFFER *tmp_buffers,
                             PRED_BUFFER **this_mode_pred, RD_STATS *best_rdc,
                             BEST_PICKMODE *best_pickmode,
                             PICK_MODE_CONTEXT *ctx,
                             unsigned int *best_sad_norm) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const unsigned char segment_id = mi->segment_id;
  const int *const rd_threshes = cpi->rd.threshes[segment_id][bsize];
  const int *const rd_thresh_freq_fact = x->thresh_freq_fact[bsize];
  const bool is_screen_content =
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  const REAL_TIME_SPEED_FEATURES *const rt_sf = &cpi->sf.rt_sf;

  const CommonQuantParams *quant_params = &cm->quant_params;

  RD_STATS this_rdc;

  int intra_cost_penalty = av1_get_intra_cost_penalty(
      quant_params->base_qindex, quant_params->y_dc_delta_q,
      cm->seq_params->bit_depth);
  int64_t inter_mode_thresh =
      RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
  int perform_intra_pred = rt_sf->check_intra_pred_nonrd;
  int force_intra_check = 0;
  // For spatial enhancement layer: turn off intra prediction if the
  // previous spatial layer as golden ref is not chosen as best reference.
  // only do this for temporal enhancement layer and on non-key frames.
  if (cpi->svc.spatial_layer_id > 0 &&
      best_pickmode->best_ref_frame != GOLDEN_FRAME &&
      cpi->svc.temporal_layer_id > 0 &&
      !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame)
    perform_intra_pred = 0;

  int do_early_exit_rdthresh = 1;

  uint32_t spatial_var_thresh = 50;
  int motion_thresh = 32;
  // Adjust thresholds to make intra mode likely tested if the other
  // references (golden, alt) are skipped/not checked. For now always
  // adjust for svc mode.
  if (cpi->ppi->use_svc || (rt_sf->use_nonrd_altref_frame == 0 &&
                            rt_sf->nonrd_prune_ref_frame_search > 0)) {
    spatial_var_thresh = 150;
    motion_thresh = 0;
  }

  // Some adjustments to checking intra mode based on source variance.
  if (x->source_variance < spatial_var_thresh) {
    // If the best inter mode is large motion or non-LAST ref reduce intra cost
    // penalty, so intra mode is more likely tested.
    if (best_rdc->rdcost != INT64_MAX &&
        (best_pickmode->best_ref_frame != LAST_FRAME ||
         abs(mi->mv[0].as_mv.row) >= motion_thresh ||
         abs(mi->mv[0].as_mv.col) >= motion_thresh)) {
      intra_cost_penalty = intra_cost_penalty >> 2;
      inter_mode_thresh =
          RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
      do_early_exit_rdthresh = 0;
    }
    if ((x->source_variance < AOMMAX(50, (spatial_var_thresh >> 1)) &&
         x->content_state_sb.source_sad_nonrd >= kHighSad) ||
        (is_screen_content && x->source_variance < 50 &&
         ((bsize >= BLOCK_32X32 &&
           x->content_state_sb.source_sad_nonrd != kZeroSad) ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)))
      force_intra_check = 1;
    // For big blocks worth checking intra (since only DC will be checked),
    // even if best_early_term is set.
    if (bsize >= BLOCK_32X32) best_early_term = 0;
  } else if (rt_sf->source_metrics_sb_nonrd &&
             x->content_state_sb.source_sad_nonrd <= kLowSad) {
    perform_intra_pred = 0;
  }

  if (best_rdc->skip_txfm && best_pickmode->best_mode_initial_skip_flag) {
    if (rt_sf->skip_intra_pred == 1 && best_pickmode->best_mode != NEWMV)
      perform_intra_pred = 0;
    else if (rt_sf->skip_intra_pred == 2)
      perform_intra_pred = 0;
  }

  if (!(best_rdc->rdcost == INT64_MAX || force_intra_check ||
        (perform_intra_pred && !best_early_term &&
         bsize <= cpi->sf.part_sf.max_intra_bsize))) {
    return;
  }

  // Early exit based on RD cost calculated using known rate. When
  // is_screen_content is true, more bias is given to intra modes. Hence,
  // considered conservative threshold in early exit for the same.
  const int64_t known_rd = is_screen_content
                               ? CALC_BIASED_RDCOST(inter_mode_thresh)
                               : inter_mode_thresh;
  if (known_rd > best_rdc->rdcost) return;

  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  if (prune_palette_testing_inter(cpi, x->source_variance))
    args.prune_palette_sad = true;
  TX_SIZE intra_tx_size = AOMMIN(
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]),
      TX_16X16);
  if (is_screen_content && cpi->rc.high_source_sad &&
      x->source_variance > spatial_var_thresh && bsize <= BLOCK_16X16)
    intra_tx_size = TX_4X4;

  PRED_BUFFER *const best_pred = best_pickmode->best_pred;
  if (reuse_prediction && best_pred != NULL) {
    const int bh = block_size_high[bsize];
    const int bw = block_size_wide[bsize];
    if (best_pred->data == orig_dst->buf) {
      *this_mode_pred = &tmp_buffers[get_pred_buffer(tmp_buffers, 3)];
      aom_convolve_copy(best_pred->data, best_pred->stride,
                        (*this_mode_pred)->data, (*this_mode_pred)->stride, bw,
                        bh);
      best_pickmode->best_pred = *this_mode_pred;
    }
  }
  pd->dst = *orig_dst;

  for (int midx = 0; midx < RTC_INTRA_MODES; ++midx) {
    const PREDICTION_MODE this_mode = intra_mode_list[midx];
    const THR_MODES mode_index = mode_idx[INTRA_FRAME][mode_offset(this_mode)];
    const int64_t mode_rd_thresh = rd_threshes[mode_index];

    if (is_prune_intra_mode(cpi, midx, force_intra_check, bsize, segment_id,
                            x->content_state_sb.source_sad_nonrd,
                            x->color_sensitivity))
      continue;

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For spatially flat blocks with zero motion only check
      // DC mode.
      if (x->content_state_sb.source_sad_nonrd == kZeroSad &&
          x->source_variance == 0 && this_mode != DC_PRED)
        continue;
      // Only test Intra for big blocks if spatial_variance is small.
      else if (bsize > BLOCK_32X32 && x->source_variance > 50)
        continue;
    }

    if (rd_less_than_thresh(best_rdc->rdcost, mode_rd_thresh,
                            rd_thresh_freq_fact[mode_index]) &&
        (do_early_exit_rdthresh || this_mode == SMOOTH_PRED)) {
      continue;
    }
    const BLOCK_SIZE uv_bsize =
        get_plane_block_size(bsize, xd->plane[AOM_PLANE_U].subsampling_x,
                             xd->plane[AOM_PLANE_U].subsampling_y);

    mi->mode = this_mode;
    mi->ref_frame[0] = INTRA_FRAME;
    mi->ref_frame[1] = NONE_FRAME;

    av1_invalid_rd_stats(&this_rdc);
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->tx_size = intra_tx_size;
    compute_intra_yprediction(cm, this_mode, bsize, x, xd);
    // Look into selecting tx_size here, based on prediction residual.
    av1_block_yrd(x, &this_rdc, &args.skippable, bsize, mi->tx_size);
    // TODO(kyslov@) Need to account for skippable
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_U,
                                             av1_estimate_block_intra, &args);
    }
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_V,
                                             av1_estimate_block_intra, &args);
    }

    int mode_cost = 0;
    if (av1_is_directional_mode(this_mode) && av1_use_angle_delta(bsize)) {
      mode_cost +=
          x->mode_costs.angle_delta_cost[this_mode - V_PRED]
                                        [MAX_ANGLE_DELTA +
                                         mi->angle_delta[PLANE_TYPE_Y]];
    }
    if (this_mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
      mode_cost += x->mode_costs.filter_intra_cost[bsize][0];
    }
    this_rdc.rate += ref_cost_intra;
    this_rdc.rate += intra_cost_penalty;
    this_rdc.rate += mode_cost;
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For blocks with low spatial variance and color sad,
      // favor the intra-modes, only on scene/slide change.
      if (cpi->rc.high_source_sad && x->source_variance < 800 &&
          (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]))
        this_rdc.rdcost = CALC_BIASED_RDCOST(this_rdc.rdcost);
      // Otherwise bias against intra for blocks with zero
      // motion and no color, on non-scene/slide changes.
      else if (!cpi->rc.high_source_sad && x->source_variance > 0 &&
               x->content_state_sb.source_sad_nonrd == kZeroSad &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
        this_rdc.rdcost = (3 * this_rdc.rdcost) >> 1;
    }

    if (this_rdc.rdcost < best_rdc->rdcost) {
      *best_rdc = this_rdc;
      best_pickmode->best_mode = this_mode;
      best_pickmode->best_tx_size = mi->tx_size;
      best_pickmode->best_ref_frame = INTRA_FRAME;
      best_pickmode->best_second_ref_frame = NONE;
      best_pickmode->best_mode_skip_txfm = this_rdc.skip_txfm;
      mi->uv_mode = this_mode;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      if (!this_rdc.skip_txfm)
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    }
  }
  if (best_pickmode->best_ref_frame == INTRA_FRAME)
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  mi->tx_size = best_pickmode->best_tx_size;

  *best_sad_norm = args.best_sad >>
                   (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);
}